

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftinit.c
# Opt level: O3

FT_Error FT_Init_FreeType(FT_Library *alibrary)

{
  FT_Library library;
  FT_Error FVar1;
  FT_Memory memory;
  FT_Module_Class *clazz;
  FT_Module_Class **ppFVar2;
  
  memory = FT_New_Memory();
  if (memory == (FT_Memory)0x0) {
    FVar1 = 7;
  }
  else {
    FVar1 = FT_New_Library(memory,alibrary);
    if (FVar1 == 0) {
      library = *alibrary;
      clazz = &autofit_module_class;
      ppFVar2 = ft_default_modules;
      do {
        ppFVar2 = ppFVar2 + 1;
        FT_Add_Module(library,clazz);
        clazz = *ppFVar2;
      } while (clazz != (FT_Module_Class *)0x0);
    }
    else {
      FT_Done_Memory(memory);
    }
    FT_Set_Default_Properties(*alibrary);
  }
  return FVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Init_FreeType( FT_Library  *alibrary )
  {
    FT_Error   error;
    FT_Memory  memory;


    /* check of `alibrary' delayed to `FT_New_Library' */

    /* First of all, allocate a new system object -- this function is part */
    /* of the system-specific component, i.e. `ftsystem.c'.                */

    memory = FT_New_Memory();
    if ( !memory )
    {
      FT_ERROR(( "FT_Init_FreeType: cannot find memory manager\n" ));
      return FT_THROW( Unimplemented_Feature );
    }

    /* build a library out of it, then fill it with the set of */
    /* default drivers.                                        */

    error = FT_New_Library( memory, alibrary );
    if ( error )
      FT_Done_Memory( memory );
    else
      FT_Add_Default_Modules( *alibrary );

    FT_Set_Default_Properties( *alibrary );

    return error;
  }